

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::detail::registerExceptionTranslatorImpl(IExceptionTranslator *et)

{
  bool bVar1;
  iterator __val;
  iterator __lhs;
  __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
  this;
  iterator __rhs;
  __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
  in_RDI;
  vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
  in_stack_fffffffffffffff0;
  
  anon_unknown_14::getExceptionTranslators();
  __val = std::
          vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
          ::begin(in_stack_ffffffffffffffd8);
  anon_unknown_14::getExceptionTranslators();
  __lhs = std::
          vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
          ::end(in_stack_ffffffffffffffd8);
  this = std::
         find<__gnu_cxx::__normal_iterator<doctest::detail::IExceptionTranslator_const**,std::vector<doctest::detail::IExceptionTranslator_const*,std::allocator<doctest::detail::IExceptionTranslator_const*>>>,doctest::detail::IExceptionTranslator_const*>
                   (in_RDI,in_stack_fffffffffffffff0,__val._M_current);
  anon_unknown_14::getExceptionTranslators();
  __rhs = std::
          vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
          ::end(in_stack_ffffffffffffffd8);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<const_doctest::detail::IExceptionTranslator_**,_std::vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>_>
                      *)__rhs._M_current);
  if (bVar1) {
    anon_unknown_14::getExceptionTranslators();
    std::
    vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
    ::push_back((vector<const_doctest::detail::IExceptionTranslator_*,_std::allocator<const_doctest::detail::IExceptionTranslator_*>_>
                 *)this._M_current,__val._M_current);
  }
  return;
}

Assistant:

void registerExceptionTranslatorImpl(const IExceptionTranslator* et) {
        if(std::find(getExceptionTranslators().begin(), getExceptionTranslators().end(), et) ==
           getExceptionTranslators().end())
            getExceptionTranslators().push_back(et);
    }